

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr * __thiscall c4::yml::Tree::key_anchor(Tree *this,size_t node)

{
  code *pcVar1;
  bool bVar2;
  NodeData *pNVar3;
  csubstr *pcVar4;
  
  pNVar3 = _p(this,node);
  if (((pNVar3->m_type).type & KEYREF) == NOTYPE) {
    pNVar3 = _p(this,node);
    if ((~(int)(pNVar3->m_type).type & 0x102U) == 0) goto LAB_001d74c6;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      pcVar4 = (csubstr *)(*pcVar1)();
      return pcVar4;
    }
  }
  to_csubstr(
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            );
  (*(code *)PTR_error_impl_00231548)
            ("check failed: ! is_key_ref(node) && has_key_anchor(node)",0x38,
             (anonymous_namespace)::s_default_callbacks);
LAB_001d74c6:
  pNVar3 = _p(this,node);
  return &(pNVar3->m_key).anchor;
}

Assistant:

csubstr    const& key_anchor(size_t node) const { RYML_ASSERT( ! is_key_ref(node) && has_key_anchor(node)); return _p(node)->m_key.anchor; }